

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

type __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::ForceVectorAlignment64<true>
          (FlatBufferBuilderImpl<true> *this,size_t len,size_t elemsize,size_t alignment)

{
  if ((this->buf_).size_ == this->length_of_64_bit_region_) {
    ForceVectorAlignment(this,len,elemsize,alignment);
    this->length_of_64_bit_region_ = (this->buf_).size_;
    return;
  }
  __assert_fail("GetSize() == length_of_64_bit_region_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x2c5,
                "typename std::enable_if<is_64, void>::type flatbuffers::FlatBufferBuilderImpl<true>::ForceVectorAlignment64(const size_t, const size_t, const size_t) [Is64Aware = true, is_64 = true]"
               );
}

Assistant:

void Clear() {
    ClearOffsets();
    buf_.clear();
    nested = false;
    finished = false;
    minalign_ = 1;
    length_of_64_bit_region_ = 0;
    if (string_pool) string_pool->clear();
  }